

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O3

bool __thiscall
deqp::egl::MultiThreadedObjectTest::runThread(MultiThreadedObjectTest *this,TestThread *thread)

{
  deUint32 err;
  Library *pLVar1;
  NotSupportedError *this_00;
  int count;
  EGLint configCount;
  EGLint attribList [5];
  int local_3c [3];
  undefined8 local_30;
  undefined4 local_28;
  
  pLVar1 = EglTestContext::getLibrary((this->super_MultiThreadedTest).super_TestCase.m_eglTestCtx);
  if (thread->m_id == 0) {
    local_3c[2] = this->m_types & (TYPE_WINDOW|TYPE_PIXMAP|TYPE_PBUFFER);
    local_3c[1] = 0x3033;
    local_30 = 0x400003040;
    local_28 = 0x3038;
    (*pLVar1->_vptr_Library[2])
              (pLVar1,(this->super_MultiThreadedTest).m_display,local_3c + 1,&this->m_config,1,
               local_3c);
    err = (*pLVar1->_vptr_Library[0x1f])(pLVar1);
    eglu::checkError(err,"chooseConfig(m_display, attribList, &m_config, 1, &configCount)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                     ,0x3ab);
    if (local_3c[0] == 0) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"No usable config found",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                 ,0x3ae);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  MultiThreadedTest::barrier(&this->super_MultiThreadedTest,thread);
  count = 100;
  if ((this->m_types & (TYPE_CONTEXT|TYPE_SINGLE_WINDOW|TYPE_PIXMAP|TYPE_PBUFFER)) ==
      TYPE_SINGLE_WINDOW) {
    if (thread->m_id != 0) goto LAB_00e12f62;
    count = 1;
  }
  createDestroyObjects(this,thread,count);
  if (thread->m_id == 0) {
    pushObjectsToShared(this,thread);
  }
LAB_00e12f62:
  MultiThreadedTest::barrier(&this->super_MultiThreadedTest,thread);
  if (thread->m_id == 1) {
    pushObjectsToShared(this,thread);
  }
  MultiThreadedTest::barrier(&this->super_MultiThreadedTest,thread);
  querySetSharedObjects(this,thread,100);
  MultiThreadedTest::barrier(&this->super_MultiThreadedTest,thread);
  if (thread->m_id == 0) {
    pullObjectsFromShared
              (this,thread,
               (int)((ulong)((long)(this->m_sharedPbuffers).
                                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(this->m_sharedPbuffers).
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 4),
               (int)((ulong)((long)(this->m_sharedNativePixmaps).
                                   super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_sharedNativePixmaps).
                                  super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5),
               (int)((ulong)((long)(this->m_sharedNativeWindows).
                                   super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_sharedNativeWindows).
                                  super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5),
               (int)((ulong)((long)(this->m_sharedContexts).
                                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(this->m_sharedContexts).
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 4));
  }
  MultiThreadedTest::barrier(&this->super_MultiThreadedTest,thread);
  if (thread->m_id == 1) {
    pullObjectsFromShared
              (this,thread,
               (int)((ulong)((long)(this->m_sharedPbuffers).
                                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(this->m_sharedPbuffers).
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3),
               (int)((ulong)((long)(this->m_sharedNativePixmaps).
                                   super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_sharedNativePixmaps).
                                  super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4),
               (int)((ulong)((long)(this->m_sharedNativeWindows).
                                   super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_sharedNativeWindows).
                                  super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4),
               (int)((ulong)((long)(this->m_sharedContexts).
                                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(this->m_sharedContexts).
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3));
  }
  MultiThreadedTest::barrier(&this->super_MultiThreadedTest,thread);
  if ((this->m_types & TYPE_SINGLE_WINDOW) == 0) {
    createDestroyObjects(this,thread,100);
  }
  destroyObjects(this,thread);
  return true;
}

Assistant:

bool MultiThreadedObjectTest::runThread (TestThread& thread)
{
	const Library&		egl		= getLibrary();

	if (thread.getId() == 0)
	{
		EGLint surfaceTypes = 0;

		if ((m_types & TYPE_WINDOW) != 0)
			surfaceTypes |= EGL_WINDOW_BIT;

		if ((m_types & TYPE_PBUFFER) != 0)
			surfaceTypes |= EGL_PBUFFER_BIT;

		if ((m_types & TYPE_PIXMAP) != 0)
			surfaceTypes |= EGL_PIXMAP_BIT;

		EGLint configCount;
		EGLint attribList[] =
		{
			EGL_SURFACE_TYPE, surfaceTypes,
			EGL_RENDERABLE_TYPE, EGL_OPENGL_ES2_BIT,
			EGL_NONE
		};

		EGLU_CHECK_CALL(egl, chooseConfig(m_display, attribList, &m_config, 1, &configCount));

		if (configCount == 0)
			TCU_THROW(NotSupportedError, "No usable config found");
	}

	barrier(thread);

	// Create / Destroy Objects
	if ((m_types & TYPE_SINGLE_WINDOW) != 0 && (m_types & TYPE_PBUFFER) == 0 && (m_types & TYPE_PIXMAP) == 0 && (m_types & TYPE_CONTEXT) == 0)
	{
		if (thread.getId() == 0)
			createDestroyObjects(thread, 1);
	}
	else
		createDestroyObjects(thread, 100);

	// Push first threads objects to shared
	if (thread.getId() == 0)
		pushObjectsToShared(thread);

	barrier(thread);

	// Push second threads objects to shared
	if (thread.getId() == 1)
		pushObjectsToShared(thread);

	barrier(thread);

	// Make queries from shared surfaces
	querySetSharedObjects(thread, 100);

	barrier(thread);

	// Pull surfaces for first thread from shared surfaces
	if (thread.getId() == 0)
		pullObjectsFromShared(thread, (int)(m_sharedPbuffers.size()/2), (int)(m_sharedNativePixmaps.size()/2), (int)(m_sharedNativeWindows.size()/2), (int)(m_sharedContexts.size()/2));

	barrier(thread);

	// Pull surfaces for second thread from shared surfaces
	if (thread.getId() == 1)
		pullObjectsFromShared(thread, (int)m_sharedPbuffers.size(), (int)m_sharedNativePixmaps.size(), (int)m_sharedNativeWindows.size(), (int)m_sharedContexts.size());

	barrier(thread);

	// Create / Destroy Objects
	if ((m_types & TYPE_SINGLE_WINDOW) == 0)
		createDestroyObjects(thread, 100);

	// Destroy surfaces
	destroyObjects(thread);

	return true;
}